

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O2

void __thiscall slang::ast::ConfigBlockSymbol::resolve(ConfigBlockSymbol *this)

{
  Token *this_00;
  InstanceOverride *this_01;
  flat_hash_map<std::string_view,_InstanceOverride> *this_02;
  flat_hash_map<const_syntax::SyntaxNode_*,_const_ConfigRule_*> *this_03;
  undefined8 *puVar1;
  char *pcVar2;
  group_type_pointer pgVar3;
  long *plVar4;
  group_type_pointer pgVar5;
  group_type_pointer pgVar6;
  group_type_pointer pgVar7;
  undefined4 uVar8;
  Compilation *this_04;
  SyntaxNode *pSVar9;
  SyntaxNode *this_05;
  group_type_pointer pgVar10;
  value_type_pointer ppVar11;
  value_type_pointer ppVar12;
  group_type_pointer pgVar13;
  value_type_pointer ppVar14;
  SourceLibrary *pSVar15;
  value_type_pointer ppVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Scope *pSVar22;
  SourceLocation SVar23;
  bool bVar24;
  byte bVar25;
  bool bVar26;
  uint uVar27;
  int iVar28;
  DefinitionSymbol *args;
  uint64_t uVar29;
  Diagnostic *pDVar30;
  flat_hash_map<std::string_view,_CellOverride> *this_06;
  size_t sVar31;
  ConfigRule *pCVar32;
  undefined4 extraout_var;
  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
  *this_07;
  undefined8 *puVar33;
  long *plVar34;
  ParameterValueAssignmentSyntax *pPVar35;
  ulong uVar36;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar37;
  ConfigBlockSymbol *src;
  ConfigBlockSymbol *extraout_RDX;
  ConfigBlockSymbol *extraout_RDX_00;
  ConfigBlockSymbol *extraout_RDX_01;
  size_t extraout_RDX_02;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  int *piVar38;
  long lVar39;
  Scope *pSVar40;
  ulong uVar41;
  ulong uVar42;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar43;
  ulong uVar44;
  pointer pTVar45;
  type *cellName_2;
  ulong uVar46;
  long lVar47;
  undefined8 sv;
  table_element_pointer ppVar48;
  pointer pTVar49;
  long lVar50;
  value_type_pointer ppVar51;
  value_type_pointer __y_00;
  value_type_pointer __y_01;
  string_view *sv_00;
  uchar uVar52;
  uchar uVar60;
  uchar uVar61;
  byte bVar62;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  char cVar63;
  char cVar68;
  char cVar69;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  string_view sVar70;
  string_view libName;
  SourceRange SVar71;
  span<const_slang::SourceLibrary_*,_18446744073709551615UL> sVar72;
  try_emplace_args_t local_331;
  int *local_330;
  string_view cellName_1;
  ConfigInstanceIdentifierSyntax **part;
  SourceLibrary *specificLib;
  Scope *scope;
  string_view cellName;
  flat_hash_map<std::string_view,_CellOverride> *__range2_1;
  anon_class_8_1_a89d2d74 checkTopOverride;
  char *local_2b0;
  flat_hash_map<std::string_view,_InstanceOverride> *__range2;
  ConfigRule rule;
  anon_class_8_1_df254053 buildRule;
  anon_class_16_2_f7902cf0 buildLiblist;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_2UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
  topCellNames;
  SmallVector<slang::ast::ConfigBlockSymbol::TopCell,_2UL> topCellsBuf;
  
  this->resolved = true;
  scope = (this->super_Symbol).parentScope;
  this_04 = scope->compilation;
  pSVar9 = (this->super_Symbol).originatingSyntax;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_2UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
  ::SmallMap(&topCellNames);
  topCellsBuf.super_SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>.data_ =
       (pointer)topCellsBuf.super_SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>.
                firstElement;
  topCellsBuf.super_SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>.len = 0;
  topCellsBuf.super_SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>.cap = 2;
  puVar33 = *(undefined8 **)(pSVar9 + 10);
  puVar1 = puVar33 + (long)pSVar9[10].parent;
  for (; puVar33 != puVar1; puVar33 = puVar33 + 1) {
    this_05 = (SyntaxNode *)*puVar33;
    sVar70 = parsing::Token::valueText((Token *)&this_05[2].parent);
    cellName = sVar70;
    if (sVar70._M_len != 0) {
      libName = parsing::Token::valueText((Token *)(this_05 + 1));
      SVar71 = slang::syntax::SyntaxNode::sourceRange(this_05);
      args = Compilation::getDefinition(this_04,this,sVar70,libName,SVar71);
      if (args != (DefinitionSymbol *)0x0) {
        cellName_1._M_len =
             topCellsBuf.super_SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>.len;
        uVar29 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            &topCellNames.super_Storage.field_0x38,&cellName);
        uVar36 = uVar29 >> (topCellNames._64_1_ & 0x3f);
        uVar8 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar29 & 0xff];
        piVar38 = (int *)0x0;
        uVar41 = uVar36;
        do {
          pcVar2 = (char *)(topCellNames._80_8_ + uVar41 * 0x10);
          bVar25 = pcVar2[0xf];
          cVar63 = (char)uVar8;
          auVar53[0] = -(*pcVar2 == cVar63);
          cVar68 = (char)((uint)uVar8 >> 8);
          auVar53[1] = -(pcVar2[1] == cVar68);
          cVar69 = (char)((uint)uVar8 >> 0x10);
          auVar53[2] = -(pcVar2[2] == cVar69);
          bVar62 = (byte)((uint)uVar8 >> 0x18);
          auVar53[3] = -(pcVar2[3] == bVar62);
          auVar53[4] = -(pcVar2[4] == cVar63);
          auVar53[5] = -(pcVar2[5] == cVar68);
          auVar53[6] = -(pcVar2[6] == cVar69);
          auVar53[7] = -(pcVar2[7] == bVar62);
          auVar53[8] = -(pcVar2[8] == cVar63);
          auVar53[9] = -(pcVar2[9] == cVar68);
          auVar53[10] = -(pcVar2[10] == cVar69);
          auVar53[0xb] = -(pcVar2[0xb] == bVar62);
          auVar53[0xc] = -(pcVar2[0xc] == cVar63);
          auVar53[0xd] = -(pcVar2[0xd] == cVar68);
          auVar53[0xe] = -(pcVar2[0xe] == cVar69);
          auVar53[0xf] = -(bVar25 == bVar62);
          uVar27 = (uint)(ushort)((ushort)(SUB161(auVar53 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe);
          if (uVar27 != 0) {
            lVar50 = topCellNames._80_8_ + uVar41 * 0x10;
            lVar39 = topCellNames._88_8_ + uVar41 * 0x168;
            local_330 = piVar38;
            do {
              uVar17 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                }
              }
              bVar24 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                       operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   *)&topCellNames.super_Storage.field_0x38,&cellName,
                                  (basic_string_view<char,_std::char_traits<char>_> *)
                                  ((ulong)uVar17 * 0x18 + lVar39));
              pSVar22 = scope;
              if (bVar24) {
                SVar71 = parsing::Token::range((Token *)&this_05[2].parent);
                pDVar30 = Scope::addDiag(pSVar22,(DiagCode)0x190006,SVar71);
                Diagnostic::operator<<(pDVar30,cellName);
                goto LAB_0047e9f7;
              }
              uVar27 = uVar27 - 1 & uVar27;
            } while (uVar27 != 0);
            bVar25 = *(byte *)(lVar50 + 0xf);
            piVar38 = local_330;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar29 & 7] & bVar25) == 0) break;
          uVar41 = (long)piVar38 + uVar41 + 1;
          piVar38 = (int *)((long)piVar38 + 1);
          uVar41 = uVar41 & topCellNames._72_8_;
        } while (piVar38 <= (ulong)topCellNames._72_8_);
        if ((ulong)topCellNames._104_8_ < (ulong)topCellNames._96_8_) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,48ul,16ul>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
                    ((locator *)&rule,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,48ul,16ul>>
                      *)&topCellNames.super_Storage.field_0x38,uVar36,uVar29,
                     (try_emplace_args_t *)&buildLiblist,&cellName,&cellName_1._M_len);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,48ul,16ul>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
                    ((locator *)&rule,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,48ul,16ul>>
                      *)&topCellNames.super_Storage.field_0x38,uVar29,
                     (try_emplace_args_t *)&buildLiblist,&cellName,&cellName_1._M_len);
        }
        rule.liblist.
        super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
        ._M_payload._M_value =
             (span<const_slang::SourceLibrary_*const,_18446744073709551615UL>)
             slang::syntax::SyntaxNode::sourceRange(this_05);
        SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>::
        emplace_back<slang::ast::DefinitionSymbol_const&,slang::SourceRange>
                  (&topCellsBuf.super_SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>,args,
                   (SourceRange *)&rule);
      }
    }
LAB_0047e9f7:
  }
  buildLiblist.scope = &scope;
  buildRule.buildLiblist = &buildLiblist;
  puVar33 = *(undefined8 **)(pSVar9 + 0xd);
  puVar1 = puVar33 + (long)pSVar9[0xd].parent;
  this_02 = &this->instanceOverrides;
  this_06 = &this->cellOverrides;
  buildLiblist.comp = this_04;
LAB_0047eab0:
  if (puVar33 != puVar1) {
    local_330 = (int *)*puVar33;
    if (*local_330 == 0x41) {
      cellName_1 = parsing::Token::valueText((Token *)(*(long *)(local_330 + 10) + 0x38));
      if (cellName_1._M_len != 0) {
        resolve::anon_class_8_1_df254053::operator()
                  (&rule,&buildRule,*(ConfigRuleClauseSyntax **)(local_330 + 0xc));
        pCVar32 = BumpAllocator::emplace<slang::ast::ConfigRule,slang::ast::ConfigRule>
                            (&this_04->super_BumpAllocator,&rule);
        checkTopOverride.scope = (Scope **)pCVar32;
        uVar29 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            this_06,&cellName_1);
        uVar46 = uVar29 >> ((byte)(this_06->table_).
                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                                  .arrays.groups_size_index & 0x3f);
        uVar8 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar29 & 0xff];
        aVar43._0_4_ = (uint)uVar29 & 7;
        aVar43._4_4_ = 0;
        uVar36 = 0;
        uVar41 = uVar46;
        do {
          pgVar10 = (this->cellOverrides).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                    .arrays.groups_;
          pgVar6 = pgVar10 + uVar41;
          bVar25 = pgVar6->m[0xf].n;
          uVar52 = (uchar)uVar8;
          auVar55[0] = -(pgVar6->m[0].n == uVar52);
          uVar60 = (uchar)((uint)uVar8 >> 8);
          auVar55[1] = -(pgVar6->m[1].n == uVar60);
          uVar61 = (uchar)((uint)uVar8 >> 0x10);
          auVar55[2] = -(pgVar6->m[2].n == uVar61);
          bVar62 = (byte)((uint)uVar8 >> 0x18);
          auVar55[3] = -(pgVar6->m[3].n == bVar62);
          auVar55[4] = -(pgVar6->m[4].n == uVar52);
          auVar55[5] = -(pgVar6->m[5].n == uVar60);
          auVar55[6] = -(pgVar6->m[6].n == uVar61);
          auVar55[7] = -(pgVar6->m[7].n == bVar62);
          auVar55[8] = -(pgVar6->m[8].n == uVar52);
          auVar55[9] = -(pgVar6->m[9].n == uVar60);
          auVar55[10] = -(pgVar6->m[10].n == uVar61);
          auVar55[0xb] = -(pgVar6->m[0xb].n == bVar62);
          auVar55[0xc] = -(pgVar6->m[0xc].n == uVar52);
          auVar55[0xd] = -(pgVar6->m[0xd].n == uVar60);
          auVar55[0xe] = -(pgVar6->m[0xe].n == uVar61);
          auVar55[0xf] = -(bVar25 == bVar62);
          uVar27 = (uint)(ushort)((ushort)(SUB161(auVar55 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar55 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar55 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar55 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar55 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar55 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar55 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar55 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar55 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar55 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar55 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar55 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar55 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar55 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar55 >> 0x77,0) & 1) << 0xe);
          if (uVar27 != 0) {
            ppVar11 = (this->cellOverrides).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                      .arrays.elements_;
            aVar37 = aVar43;
            do {
              uVar17 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                }
              }
              ppVar51 = ppVar11 + uVar41 * 0xf + (ulong)uVar17;
              bVar24 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                       operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   *)this_06,&cellName_1,&ppVar51->first);
              if (bVar24) goto LAB_0047ee2c;
              uVar27 = uVar27 - 1 & uVar27;
            } while (uVar27 != 0);
            bVar25 = pgVar10[uVar41].m[0xf].n;
          }
          if (((byte)((basic_string_view<char,_std::char_traits<char>_> *)(aVar43.values_ + 0x49e79)
                     )->_M_len & bVar25) == 0) break;
          uVar42 = (this->cellOverrides).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                   .arrays.groups_size_mask;
          lVar39 = uVar41 + uVar36;
          uVar36 = uVar36 + 1;
          uVar41 = lVar39 + 1U & uVar42;
        } while (uVar36 <= uVar42);
        if ((this->cellOverrides).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
            .size_ctrl.size <
            (this->cellOverrides).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
            .size_ctrl.ml) {
          aVar37.values_ = (value<fmt::v11::context> *)&cellName_1;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                    ((locator *)&rule,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
                      *)this_06,uVar46,uVar29,(try_emplace_args_t *)&cellName,
                     (basic_string_view<char,_std::char_traits<char>_> *)aVar37.values_);
          ppVar51 = (value_type_pointer)
                    rule.liblist.
                    super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                    ._16_8_;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                    ((locator *)&rule,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
                      *)this_06,uVar29,(try_emplace_args_t *)&cellName,&cellName_1);
          aVar37 = aVar43;
          ppVar51 = (value_type_pointer)
                    rule.liblist.
                    super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                    ._16_8_;
        }
LAB_0047ee2c:
        sVar70 = parsing::Token::valueText((Token *)(*(long *)(local_330 + 10) + 0x18));
        pSVar22 = scope;
        if (sVar70._M_len == 0) {
          pCVar32 = (ppVar51->second).defaultRule;
          if (pCVar32 == (ConfigRule *)0x0) {
            (ppVar51->second).defaultRule = (ConfigRule *)checkTopOverride.scope;
          }
          else {
            pPVar35 = (ParameterValueAssignmentSyntax *)checkTopOverride.scope[10];
            if ((((pPVar35 == (ParameterValueAssignmentSyntax *)0x0) ||
                 (pCVar32->paramOverrides == (ParameterValueAssignmentSyntax *)0x0)) &&
                ((cVar63 = *(char *)(checkTopOverride.scope + 2), cVar63 != '\x01' ||
                 ((pCVar32->liblist).
                  super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                  ._M_engaged == false)))) &&
               ((pSVar40 = checkTopOverride.scope[5], pSVar40 == (Scope *)0x0 ||
                ((pCVar32->useCell).name._M_len == 0)))) {
LAB_0047f6d0:
              if (pPVar35 != (ParameterValueAssignmentSyntax *)0x0) {
                pCVar32->paramOverrides = pPVar35;
              }
              if (cVar63 != '\0') {
                *(Scope **)
                 &(pCVar32->liblist).
                  super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                  ._M_engaged = checkTopOverride.scope[2];
                pSVar22 = checkTopOverride.scope[1];
                (pCVar32->liblist).
                super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                ._M_payload._M_value._M_ptr = (pointer)*checkTopOverride.scope;
                (pCVar32->liblist).
                super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                ._M_payload._M_value._M_extent._M_extent_value = (size_t)pSVar22;
                pSVar40 = checkTopOverride.scope[5];
              }
              if (pSVar40 != (Scope *)0x0) {
                (pCVar32->useCell).targetConfig = *(bool *)(checkTopOverride.scope + 9);
                pSVar22 = checkTopOverride.scope[3];
                pSVar40 = checkTopOverride.scope[4];
                sVar70 = *(string_view *)(checkTopOverride.scope + 5);
                SVar23 = *(SourceLocation *)(checkTopOverride.scope + 8);
                (pCVar32->useCell).sourceRange.startLoc =
                     *(SourceLocation *)(checkTopOverride.scope + 7);
                (pCVar32->useCell).sourceRange.endLoc = SVar23;
                (pCVar32->useCell).name = sVar70;
                (pCVar32->useCell).lib._M_len = (size_t)pSVar22;
                (pCVar32->useCell).lib._M_str = (char *)pSVar40;
                (pCVar32->syntax).ptr = (SyntaxNode *)checkTopOverride.scope[0xb];
              }
            }
            else {
              SVar71 = slang::syntax::SyntaxNode::sourceRange
                                 ((SyntaxNode *)checkTopOverride.scope[0xb]);
              pDVar30 = Scope::addDiag(pSVar22,(DiagCode)0xeb0006,SVar71);
              cellName._M_str = (char *)cellName_1._M_len;
              cellName._M_len = (size_t)cellName_1._M_str;
              args_00.field_1.args_ = aVar37.args_;
              args_00.desc_ = (unsigned_long_long)&cellName;
              fmt.size_ = 0xd;
              fmt.data_ = (char *)0x9;
              ::fmt::v11::vformat_abi_cxx11_((string *)&rule,(v11 *)"cell \'{}\'",fmt,args_00);
              pDVar30 = Diagnostic::operator<<(pDVar30,(string *)&rule);
              std::__cxx11::string::~string((string *)&rule);
              SVar71 = slang::syntax::SyntaxNode::sourceRange((pCVar32->syntax).ptr);
              Diagnostic::addNote(pDVar30,(DiagCode)0xa0001,SVar71);
            }
          }
        }
        else {
          specificLib = Compilation::getSourceLibrary(this_04,sVar70);
          pSVar22 = scope;
          if (specificLib == (SourceLibrary *)0x0) {
            SVar71 = parsing::Token::range((Token *)(*(long *)(local_330 + 10) + 0x18));
            pDVar30 = Scope::addDiag(pSVar22,(DiagCode)0xff0006,SVar71);
            Diagnostic::operator<<(pDVar30,sVar70);
          }
          else {
            auVar18._8_8_ = 0;
            auVar18._0_8_ = specificLib;
            uVar41 = SUB168(auVar18 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                     SUB168(auVar18 * ZEXT816(0x9e3779b97f4a7c15),0);
            aVar37.values_ =
                 (value<fmt::v11::context> *)
                 (uVar41 >>
                 ((byte)(ppVar51->second).specificLibRules.table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                        .arrays.groups_size_index & 0x3f));
            uVar8 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[uVar41 & 0xff];
            uVar36 = 0;
            aVar43.values_ = aVar37.values_;
            do {
              pgVar3 = (ppVar51->second).specificLibRules.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                       .arrays.groups_ + (long)aVar43;
              bVar25 = pgVar3->m[0xf].n;
              uVar52 = (uchar)uVar8;
              auVar64[0] = -(pgVar3->m[0].n == uVar52);
              uVar60 = (uchar)((uint)uVar8 >> 8);
              auVar64[1] = -(pgVar3->m[1].n == uVar60);
              uVar61 = (uchar)((uint)uVar8 >> 0x10);
              auVar64[2] = -(pgVar3->m[2].n == uVar61);
              bVar62 = (byte)((uint)uVar8 >> 0x18);
              auVar64[3] = -(pgVar3->m[3].n == bVar62);
              auVar64[4] = -(pgVar3->m[4].n == uVar52);
              auVar64[5] = -(pgVar3->m[5].n == uVar60);
              auVar64[6] = -(pgVar3->m[6].n == uVar61);
              auVar64[7] = -(pgVar3->m[7].n == bVar62);
              auVar64[8] = -(pgVar3->m[8].n == uVar52);
              auVar64[9] = -(pgVar3->m[9].n == uVar60);
              auVar64[10] = -(pgVar3->m[10].n == uVar61);
              auVar64[0xb] = -(pgVar3->m[0xb].n == bVar62);
              auVar64[0xc] = -(pgVar3->m[0xc].n == uVar52);
              auVar64[0xd] = -(pgVar3->m[0xd].n == uVar60);
              auVar64[0xe] = -(pgVar3->m[0xe].n == uVar61);
              auVar64[0xf] = -(bVar25 == bVar62);
              uVar27 = (uint)(ushort)((ushort)(SUB161(auVar64 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar64 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar64 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar64 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar64 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar64 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar64 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar64 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar64 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar64 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar64 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar64 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar64 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar64 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar64 >> 0x77,0) & 1) << 0xe);
              if (uVar27 != 0) {
                ppVar12 = (ppVar51->second).specificLibRules.table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                          .arrays.elements_;
                do {
                  iVar28 = 0;
                  if (uVar27 != 0) {
                    for (; (uVar27 >> iVar28 & 1) == 0; iVar28 = iVar28 + 1) {
                    }
                  }
                  if (specificLib ==
                      *(SourceLibrary **)
                       ((long)&ppVar12[(long)aVar43.values_ * 0xf].first +
                       (ulong)(uint)(iVar28 << 4))) {
                    pCVar32 = *(ConfigRule **)
                               ((long)&ppVar12[(long)aVar43.values_ * 0xf].second +
                               (ulong)(uint)(iVar28 << 4));
                    pPVar35 = (ParameterValueAssignmentSyntax *)checkTopOverride.scope[10];
                    if ((((pPVar35 == (ParameterValueAssignmentSyntax *)0x0) ||
                         (pCVar32->paramOverrides == (ParameterValueAssignmentSyntax *)0x0)) &&
                        ((cVar63 = *(char *)(checkTopOverride.scope + 2), cVar63 != '\x01' ||
                         ((pCVar32->liblist).
                          super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                          ._M_engaged == false)))) &&
                       ((pSVar40 = checkTopOverride.scope[5], pSVar40 == (Scope *)0x0 ||
                        ((pCVar32->useCell).name._M_len == 0)))) goto LAB_0047f6d0;
                    SVar71 = slang::syntax::SyntaxNode::sourceRange
                                       ((SyntaxNode *)checkTopOverride.scope[0xb]);
                    pDVar30 = Scope::addDiag(pSVar22,(DiagCode)0xeb0006,SVar71);
                    rule.liblist.
                    super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                    ._M_payload._M_value._M_ptr = (pointer)(specificLib->name)._M_dataplus;
                    rule.liblist.
                    super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                    ._M_payload._M_value._M_extent._M_extent_value =
                         (__extent_storage<18446744073709551615UL>)
                         (specificLib->name)._M_string_length;
                    rule.liblist.
                    super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                    ._16_8_ = cellName_1._M_str;
                    rule.useCell.lib._M_len = cellName_1._M_len;
                    args_01.field_1.values_ = aVar43.values_;
                    args_01.desc_ = (unsigned_long_long)&rule;
                    fmt_00.size_ = 0xdd;
                    fmt_00.data_ = (char *)0xc;
                    ::fmt::v11::vformat_abi_cxx11_
                              ((string *)&cellName,(v11 *)"cell \'{}.{}\'",fmt_00,args_01);
                    pDVar30 = Diagnostic::operator<<(pDVar30,(string *)&cellName);
                    std::__cxx11::string::~string((string *)&cellName);
                    SVar71 = slang::syntax::SyntaxNode::sourceRange((pCVar32->syntax).ptr);
                    Diagnostic::addNote(pDVar30,(DiagCode)0xa0001,SVar71);
                    goto LAB_0047efb4;
                  }
                  uVar27 = uVar27 - 1 & uVar27;
                } while (uVar27 != 0);
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[(uint)uVar41 & 7] & bVar25) == 0)
              break;
              uVar46 = (ppVar51->second).specificLibRules.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                       .arrays.groups_size_mask;
              lVar39 = uVar36 + 1;
              uVar36 = uVar36 + 1;
              aVar43.values_ =
                   (value<fmt::v11::context> *)((long)&(aVar43.values_)->field_0 + lVar39 & uVar46);
            } while (uVar36 <= uVar46);
            if ((ppVar51->second).specificLibRules.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                .size_ctrl.size <
                (ppVar51->second).specificLibRules.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                .size_ctrl.ml) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::SourceLibrary_const*,slang::ast::ConfigRule*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SourceLibrary_const*,void>,std::equal_to<slang::SourceLibrary_const*>,std::allocator<std::pair<slang::SourceLibrary_const*const,slang::ast::ConfigRule*>>>
              ::
              unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::SourceLibrary_const*&,slang::ast::ConfigRule*&>
                        ((locator_conflict *)&rule,
                         (table_core<boost::unordered::detail::foa::flat_map_types<slang::SourceLibrary_const*,slang::ast::ConfigRule*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SourceLibrary_const*,void>,std::equal_to<slang::SourceLibrary_const*>,std::allocator<std::pair<slang::SourceLibrary_const*const,slang::ast::ConfigRule*>>>
                          *)&ppVar51->second,(size_t)aVar37,uVar41,(try_emplace_args_t *)&cellName,
                         &specificLib,(ConfigRule **)&checkTopOverride);
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::SourceLibrary_const*,slang::ast::ConfigRule*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SourceLibrary_const*,void>,std::equal_to<slang::SourceLibrary_const*>,std::allocator<std::pair<slang::SourceLibrary_const*const,slang::ast::ConfigRule*>>>
              ::
              unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::SourceLibrary_const*&,slang::ast::ConfigRule*&>
                        ((locator_conflict *)&rule,
                         (table_core<boost::unordered::detail::foa::flat_map_types<slang::SourceLibrary_const*,slang::ast::ConfigRule*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SourceLibrary_const*,void>,std::equal_to<slang::SourceLibrary_const*>,std::allocator<std::pair<slang::SourceLibrary_const*const,slang::ast::ConfigRule*>>>
                          *)&ppVar51->second,uVar41,(try_emplace_args_t *)&cellName,&specificLib,
                         (ConfigRule **)&checkTopOverride);
            }
          }
        }
      }
    }
    else if (*local_330 == 0xfd) {
      this_00 = (Token *)(local_330 + 10);
      _checkTopOverride = parsing::Token::valueText(this_00);
      if (checkTopOverride.scope != 0) {
        uVar29 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            &topCellNames.super_Storage.field_0x38,
                            (basic_string_view<char,_std::char_traits<char>_> *)&checkTopOverride);
        uVar36 = uVar29 >> (topCellNames._64_1_ & 0x3f);
        uVar8 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar29 & 0xff];
        uVar41 = 0;
        do {
          pcVar2 = (char *)(topCellNames._80_8_ + uVar36 * 0x10);
          bVar25 = pcVar2[0xf];
          cVar63 = (char)uVar8;
          auVar54[0] = -(*pcVar2 == cVar63);
          cVar68 = (char)((uint)uVar8 >> 8);
          auVar54[1] = -(pcVar2[1] == cVar68);
          cVar69 = (char)((uint)uVar8 >> 0x10);
          auVar54[2] = -(pcVar2[2] == cVar69);
          bVar62 = (byte)((uint)uVar8 >> 0x18);
          auVar54[3] = -(pcVar2[3] == bVar62);
          auVar54[4] = -(pcVar2[4] == cVar63);
          auVar54[5] = -(pcVar2[5] == cVar68);
          auVar54[6] = -(pcVar2[6] == cVar69);
          auVar54[7] = -(pcVar2[7] == bVar62);
          auVar54[8] = -(pcVar2[8] == cVar63);
          auVar54[9] = -(pcVar2[9] == cVar68);
          auVar54[10] = -(pcVar2[10] == cVar69);
          auVar54[0xb] = -(pcVar2[0xb] == bVar62);
          auVar54[0xc] = -(pcVar2[0xc] == cVar63);
          auVar54[0xd] = -(pcVar2[0xd] == cVar68);
          auVar54[0xe] = -(pcVar2[0xe] == cVar69);
          auVar54[0xf] = -(bVar25 == bVar62);
          uVar27 = (uint)(ushort)((ushort)(SUB161(auVar54 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar54 >> 0x77,0) & 1) << 0xe);
          if (uVar27 != 0) {
            lVar50 = topCellNames._80_8_ + uVar36 * 0x10;
            lVar39 = topCellNames._88_8_ + uVar36 * 0x168;
            do {
              uVar17 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                }
              }
              bVar24 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                       operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   *)&topCellNames.super_Storage.field_0x38,
                                  (basic_string_view<char,_std::char_traits<char>_> *)
                                  &checkTopOverride,
                                  (basic_string_view<char,_std::char_traits<char>_> *)
                                  ((ulong)uVar17 * 0x18 + lVar39));
              if (bVar24) {
                uVar29 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                         operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                     *)this_02,
                                    (basic_string_view<char,_std::char_traits<char>_> *)
                                    &checkTopOverride);
                uVar46 = uVar29 >> ((byte)(this_02->table_).
                                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                          .arrays.groups_size_index & 0x3f);
                uVar8 = (&boost::unordered::detail::foa::
                          group15<boost::unordered::detail::foa::plain_integral>::
                          match_word(unsigned_long)::word)[uVar29 & 0xff];
                uVar36 = 0;
                uVar41 = uVar46;
                goto LAB_0047f004;
              }
              uVar27 = uVar27 - 1 & uVar27;
            } while (uVar27 != 0);
            bVar25 = *(byte *)(lVar50 + 0xf);
          }
          pSVar22 = scope;
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar29 & 7] & bVar25) == 0) break;
          lVar39 = uVar36 + uVar41;
          uVar41 = uVar41 + 1;
          uVar36 = lVar39 + 1U & topCellNames._72_8_;
        } while (uVar41 <= (ulong)topCellNames._72_8_);
        SVar71 = parsing::Token::range(this_00);
        Scope::addDiag(pSVar22,(DiagCode)0x1b0006,SVar71);
      }
    }
    else {
      sVar72 = resolve::anon_class_16_2_f7902cf0::operator()
                         (&buildLiblist,*(ConfigLiblistSyntax **)(local_330 + 10));
      (this->defaultLiblist)._M_ptr = sVar72._M_ptr;
      (this->defaultLiblist)._M_extent =
           (__extent_storage<18446744073709551615UL>)sVar72._M_extent._M_extent_value;
    }
    goto LAB_0047efb4;
  }
  checkTopOverride.scope = &scope;
  rule.liblist.
  super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
  ._M_payload.
  super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
  ._M_payload._M_value =
       (span<const_slang::SourceLibrary_*const,_18446744073709551615UL>)
       boost::unordered::detail::foa::
       table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
       ::begin(&this_02->table_);
  src = rule.liblist.
        super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
        ._M_payload._8_8_;
  sv = src;
  while ((ConfigBlockSymbol *)sv != (ConfigBlockSymbol *)0x0) {
    if (((Scope *)(sv + 0x40))->compilation != (Compilation *)0x0) {
      uVar29 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                          &topCellNames.super_Storage.field_0x38,
                          (basic_string_view<char,_std::char_traits<char>_> *)sv);
      uVar36 = uVar29 >> (topCellNames._64_1_ & 0x3f);
      uVar8 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar29 & 0xff];
      uVar41 = 0;
      do {
        pcVar2 = (char *)(topCellNames._80_8_ + uVar36 * 0x10);
        bVar25 = pcVar2[0xf];
        cVar63 = (char)uVar8;
        auVar58[0] = -(*pcVar2 == cVar63);
        cVar68 = (char)((uint)uVar8 >> 8);
        auVar58[1] = -(pcVar2[1] == cVar68);
        cVar69 = (char)((uint)uVar8 >> 0x10);
        auVar58[2] = -(pcVar2[2] == cVar69);
        bVar62 = (byte)((uint)uVar8 >> 0x18);
        auVar58[3] = -(pcVar2[3] == bVar62);
        auVar58[4] = -(pcVar2[4] == cVar63);
        auVar58[5] = -(pcVar2[5] == cVar68);
        auVar58[6] = -(pcVar2[6] == cVar69);
        auVar58[7] = -(pcVar2[7] == bVar62);
        auVar58[8] = -(pcVar2[8] == cVar63);
        auVar58[9] = -(pcVar2[9] == cVar68);
        auVar58[10] = -(pcVar2[10] == cVar69);
        auVar58[0xb] = -(pcVar2[0xb] == bVar62);
        auVar58[0xc] = -(pcVar2[0xc] == cVar63);
        auVar58[0xd] = -(pcVar2[0xd] == cVar68);
        auVar58[0xe] = -(pcVar2[0xe] == cVar69);
        auVar58[0xf] = -(bVar25 == bVar62);
        uVar27 = (uint)(ushort)((ushort)(SUB161(auVar58 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar58 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar58 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar58 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar58 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar58 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar58 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar58 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar58 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar58 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar58 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar58 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar58 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar58 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar58 >> 0x77,0) & 1) << 0xe);
        if (uVar27 != 0) {
          lVar50 = topCellNames._80_8_ + uVar36 * 0x10;
          lVar39 = topCellNames._88_8_ + uVar36 * 0x168;
          do {
            uVar17 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            __y = (basic_string_view<char,_std::char_traits<char>_> *)
                  ((ulong)uVar17 * 0x18 + lVar39);
            bVar24 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                     operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                                &topCellNames.super_Storage.field_0x38,
                                (basic_string_view<char,_std::char_traits<char>_> *)sv,__y);
            if (bVar24) goto LAB_0047f960;
            uVar27 = uVar27 - 1 & uVar27;
          } while (uVar27 != 0);
          bVar25 = *(byte *)(lVar50 + 0xf);
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar29 & 7] & bVar25) == 0) break;
        lVar39 = uVar36 + uVar41;
        uVar41 = uVar41 + 1;
        uVar36 = lVar39 + 1U & topCellNames._72_8_;
      } while (uVar41 <= (ulong)topCellNames._72_8_);
      __y = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
LAB_0047f960:
      resolve::anon_class_8_1_a89d2d74::operator()
                (&checkTopOverride,(ConfigRule *)((Scope *)(sv + 0x40))->compilation);
      topCellsBuf.super_SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>.data_[__y[1]._M_len]
      .rule = (ConfigRule *)((Scope *)(sv + 0x40))->compilation;
    }
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
    ::increment((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                 *)&rule);
    src = extraout_RDX;
    sv = rule.liblist.
         super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
         ._M_payload.
         super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
         ._M_payload._M_value._M_extent._M_extent_value;
  }
  pTVar45 = topCellsBuf.super_SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>.data_ +
            topCellsBuf.super_SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>.len;
  pTVar49 = topCellsBuf.super_SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>.data_;
LAB_0047f9c0:
  if (pTVar49 == pTVar45) {
    iVar28 = SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>::copy
                       (&topCellsBuf.super_SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>,
                        (EVP_PKEY_CTX *)this_04,(EVP_PKEY_CTX *)src);
    (this->topCells)._M_ptr = (pointer)CONCAT44(extraout_var,iVar28);
    (this->topCells)._M_extent._M_extent_value = extraout_RDX_02;
    cellName = (string_view)
               boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
               ::begin(&this_06->table_);
    this_03 = &this->ruleBySyntax;
    ppVar48 = (table_element_pointer)cellName._M_str;
    do {
      if (ppVar48 == (table_element_pointer)0x0) {
        this_07 = &getInstanceOverrides(this)->table_;
        rule.liblist.
        super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
        ._M_payload._M_value =
             (span<const_slang::SourceLibrary_*const,_18446744073709551615UL>)
             boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
             ::begin(this_07);
        while (rule.liblist.
               super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
               ._M_payload._M_value._M_extent._M_extent_value != 0) {
          registerRules(this,(InstanceOverride *)
                             ((long)rule.liblist.
                                    super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                                    ._M_payload.
                                    super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                                    ._M_payload._M_value._M_extent._M_extent_value + 0x10));
          boost::unordered::detail::foa::
          table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
          ::increment((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                       *)&rule);
        }
        SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>::cleanup
                  (&topCellsBuf.super_SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>,
                   (EVP_PKEY_CTX *)0x0);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
        ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                       *)&topCellNames.super_Storage.field_0x38);
        return;
      }
      pCVar32 = (ppVar48->second).defaultRule;
      if (pCVar32 != (ConfigRule *)0x0) {
        pSVar9 = (pCVar32->syntax).ptr;
        cellName_1._M_len = (size_t)pSVar9;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = pSVar9;
        uVar42 = SUB168(auVar20 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar20 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar46 = uVar42 >> ((byte)(this->ruleBySyntax).table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                  .arrays.groups_size_index & 0x3f);
        uVar8 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar42 & 0xff];
        ppVar16 = (this->ruleBySyntax).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                  .arrays.elements_;
        uVar41 = (this->ruleBySyntax).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                 .arrays.groups_size_mask;
        uVar44 = 0;
        uVar36 = uVar46;
        do {
          pgVar5 = (this->ruleBySyntax).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                   .arrays.groups_ + uVar36;
          bVar25 = pgVar5->m[0xf].n;
          uVar52 = (uchar)uVar8;
          auVar66[0] = -(pgVar5->m[0].n == uVar52);
          uVar60 = (uchar)((uint)uVar8 >> 8);
          auVar66[1] = -(pgVar5->m[1].n == uVar60);
          uVar61 = (uchar)((uint)uVar8 >> 0x10);
          auVar66[2] = -(pgVar5->m[2].n == uVar61);
          bVar62 = (byte)((uint)uVar8 >> 0x18);
          auVar66[3] = -(pgVar5->m[3].n == bVar62);
          auVar66[4] = -(pgVar5->m[4].n == uVar52);
          auVar66[5] = -(pgVar5->m[5].n == uVar60);
          auVar66[6] = -(pgVar5->m[6].n == uVar61);
          auVar66[7] = -(pgVar5->m[7].n == bVar62);
          auVar66[8] = -(pgVar5->m[8].n == uVar52);
          auVar66[9] = -(pgVar5->m[9].n == uVar60);
          auVar66[10] = -(pgVar5->m[10].n == uVar61);
          auVar66[0xb] = -(pgVar5->m[0xb].n == bVar62);
          auVar66[0xc] = -(pgVar5->m[0xc].n == uVar52);
          auVar66[0xd] = -(pgVar5->m[0xd].n == uVar60);
          auVar66[0xe] = -(pgVar5->m[0xe].n == uVar61);
          auVar66[0xf] = -(bVar25 == bVar62);
          for (uVar27 = (uint)(ushort)((ushort)(SUB161(auVar66 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar66 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar66 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar66 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar66 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar66 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar66 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar66 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar66 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar66 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar66 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar66 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar66 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar66 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar66 >> 0x77,0) & 1) << 0xe); uVar27 != 0;
              uVar27 = uVar27 - 1 & uVar27) {
            iVar28 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> iVar28 & 1) == 0; iVar28 = iVar28 + 1) {
              }
            }
            if (pSVar9 == *(SyntaxNode **)
                           ((long)&ppVar16[uVar36 * 0xf].first + (ulong)(uint)(iVar28 << 4))) {
              lVar39 = (long)&ppVar16[uVar36 * 0xf].first + (ulong)(uint)(iVar28 << 4);
              goto LAB_0047fdbf;
            }
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar42 & 7] & bVar25) == 0) break;
          lVar39 = uVar36 + uVar44;
          uVar44 = uVar44 + 1;
          uVar36 = lVar39 + 1U & uVar41;
        } while (uVar44 <= uVar41);
        if ((this->ruleBySyntax).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
            .size_ctrl.size <
            (this->ruleBySyntax).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
            .size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                    ((locator *)&rule,
                     (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                      *)this_03,uVar46,uVar42,(try_emplace_args_t *)&specificLib,
                     (SyntaxNode **)&cellName_1);
          lVar39 = rule.liblist.
                   super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                   ._16_8_;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                    ((locator *)&rule,
                     (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                      *)this_03,uVar42,(try_emplace_args_t *)&specificLib,(SyntaxNode **)&cellName_1
                    );
          lVar39 = rule.liblist.
                   super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                   ._16_8_;
        }
LAB_0047fdbf:
        *(ConfigRule **)(lVar39 + 8) = pCVar32;
      }
      cellName_1 = (string_view)
                   boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                   ::begin((table<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                            *)&ppVar48->second);
      while ((table_element_pointer_conflict)cellName_1._M_str !=
             (table_element_pointer_conflict)0x0) {
        pCVar32 = ((table_element_pointer_conflict)cellName_1._M_str)->second;
        specificLib = (SourceLibrary *)(pCVar32->syntax).ptr;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = specificLib;
        uVar42 = SUB168(auVar21 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar21 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar46 = uVar42 >> ((byte)(this->ruleBySyntax).table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                  .arrays.groups_size_index & 0x3f);
        uVar8 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar42 & 0xff];
        ppVar16 = (this->ruleBySyntax).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                  .arrays.elements_;
        uVar41 = (this->ruleBySyntax).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                 .arrays.groups_size_mask;
        uVar44 = 0;
        uVar36 = uVar46;
        do {
          pgVar5 = (this->ruleBySyntax).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                   .arrays.groups_ + uVar36;
          bVar25 = pgVar5->m[0xf].n;
          uVar52 = (uchar)uVar8;
          auVar67[0] = -(pgVar5->m[0].n == uVar52);
          uVar60 = (uchar)((uint)uVar8 >> 8);
          auVar67[1] = -(pgVar5->m[1].n == uVar60);
          uVar61 = (uchar)((uint)uVar8 >> 0x10);
          auVar67[2] = -(pgVar5->m[2].n == uVar61);
          bVar62 = (byte)((uint)uVar8 >> 0x18);
          auVar67[3] = -(pgVar5->m[3].n == bVar62);
          auVar67[4] = -(pgVar5->m[4].n == uVar52);
          auVar67[5] = -(pgVar5->m[5].n == uVar60);
          auVar67[6] = -(pgVar5->m[6].n == uVar61);
          auVar67[7] = -(pgVar5->m[7].n == bVar62);
          auVar67[8] = -(pgVar5->m[8].n == uVar52);
          auVar67[9] = -(pgVar5->m[9].n == uVar60);
          auVar67[10] = -(pgVar5->m[10].n == uVar61);
          auVar67[0xb] = -(pgVar5->m[0xb].n == bVar62);
          auVar67[0xc] = -(pgVar5->m[0xc].n == uVar52);
          auVar67[0xd] = -(pgVar5->m[0xd].n == uVar60);
          auVar67[0xe] = -(pgVar5->m[0xe].n == uVar61);
          auVar67[0xf] = -(bVar25 == bVar62);
          for (uVar27 = (uint)(ushort)((ushort)(SUB161(auVar67 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar67 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar67 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar67 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar67 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar67 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar67 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar67 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar67 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar67 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar67 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar67 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar67 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar67 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar67 >> 0x77,0) & 1) << 0xe); uVar27 != 0;
              uVar27 = uVar27 - 1 & uVar27) {
            iVar28 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> iVar28 & 1) == 0; iVar28 = iVar28 + 1) {
              }
            }
            if (specificLib ==
                *(SourceLibrary **)((long)&ppVar16[uVar36 * 0xf].first + (ulong)(uint)(iVar28 << 4))
               ) {
              lVar39 = (long)&ppVar16[uVar36 * 0xf].first + (ulong)(uint)(iVar28 << 4);
              goto LAB_0047ff08;
            }
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar42 & 7] & bVar25) == 0) break;
          lVar39 = uVar36 + uVar44;
          uVar44 = uVar44 + 1;
          uVar36 = lVar39 + 1U & uVar41;
        } while (uVar44 <= uVar41);
        if ((this->ruleBySyntax).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
            .size_ctrl.size <
            (this->ruleBySyntax).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
            .size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                    ((locator *)&rule,
                     (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                      *)this_03,uVar46,uVar42,&local_331,(SyntaxNode **)&specificLib);
          lVar39 = rule.liblist.
                   super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                   ._16_8_;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                    ((locator *)&rule,
                     (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                      *)this_03,uVar42,&local_331,(SyntaxNode **)&specificLib);
          lVar39 = rule.liblist.
                   super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                   ._16_8_;
        }
LAB_0047ff08:
        *(ConfigRule **)(lVar39 + 8) = pCVar32;
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
        ::increment((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>_conflict
                     *)&cellName_1);
      }
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      ::increment((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                   *)&cellName);
      ppVar48 = (table_element_pointer)cellName._M_str;
    } while( true );
  }
  if (pTVar49->rule == (ConfigRule *)0x0) {
    sv_00 = &(pTVar49->definition->super_Symbol).name;
    uVar29 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this_06
                        ,sv_00);
    piVar38 = (int *)(uVar29 >>
                     ((byte)(this_06->table_).
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                            .arrays.groups_size_index & 0x3f));
    uVar8 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar29 & 0xff];
    uVar41 = 0;
    do {
      pgVar10 = (this->cellOverrides).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                .arrays.groups_;
      pgVar6 = pgVar10 + (long)piVar38;
      bVar25 = pgVar6->m[0xf].n;
      uVar52 = (uchar)uVar8;
      auVar59[0] = -(pgVar6->m[0].n == uVar52);
      uVar60 = (uchar)((uint)uVar8 >> 8);
      auVar59[1] = -(pgVar6->m[1].n == uVar60);
      uVar61 = (uchar)((uint)uVar8 >> 0x10);
      auVar59[2] = -(pgVar6->m[2].n == uVar61);
      bVar62 = (byte)((uint)uVar8 >> 0x18);
      auVar59[3] = -(pgVar6->m[3].n == bVar62);
      auVar59[4] = -(pgVar6->m[4].n == uVar52);
      auVar59[5] = -(pgVar6->m[5].n == uVar60);
      auVar59[6] = -(pgVar6->m[6].n == uVar61);
      auVar59[7] = -(pgVar6->m[7].n == bVar62);
      auVar59[8] = -(pgVar6->m[8].n == uVar52);
      auVar59[9] = -(pgVar6->m[9].n == uVar60);
      auVar59[10] = -(pgVar6->m[10].n == uVar61);
      auVar59[0xb] = -(pgVar6->m[0xb].n == bVar62);
      auVar59[0xc] = -(pgVar6->m[0xc].n == uVar52);
      auVar59[0xd] = -(pgVar6->m[0xd].n == uVar60);
      auVar59[0xe] = -(pgVar6->m[0xe].n == uVar61);
      auVar59[0xf] = -(bVar25 == bVar62);
      uVar27 = (uint)(ushort)((ushort)(SUB161(auVar59 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar59 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar59 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar59 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar59 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar59 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar59 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar59 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar59 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar59 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar59 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar59 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar59 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar59 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar59 >> 0x77,0) & 1) << 0xe);
      src = this;
      if (uVar27 != 0) {
        ppVar11 = (this->cellOverrides).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                  .arrays.elements_;
        local_330 = piVar38;
        do {
          uVar17 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
            }
          }
          ppVar51 = ppVar11 + (long)piVar38 * 0xf + (ulong)uVar17;
          bVar24 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              this_06,sv_00,&ppVar51->first);
          if (bVar24) {
            pCVar32 = (ppVar51->second).defaultRule;
            pTVar49->rule = pCVar32;
            pSVar15 = pTVar49->definition->sourceLibrary;
            auVar19._8_8_ = 0;
            auVar19._0_8_ = pSVar15;
            uVar36 = SUB168(auVar19 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                     SUB168(auVar19 * ZEXT816(0x9e3779b97f4a7c15),0);
            uVar41 = uVar36 >> ((byte)(ppVar51->second).specificLibRules.table_.
                                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                      .arrays.groups_size_index & 0x3f);
            uVar8 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[uVar36 & 0xff];
            src = (ConfigBlockSymbol *)(ulong)((uint)uVar36 & 7);
            uVar36 = 0;
            goto LAB_0047fb64;
          }
          uVar27 = uVar27 - 1 & uVar27;
        } while (uVar27 != 0);
        bVar25 = pgVar10[(long)piVar38].m[0xf].n;
        src = extraout_RDX_00;
        piVar38 = local_330;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar29 & 7] & bVar25) == 0) break;
      uVar36 = (this->cellOverrides).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
               .arrays.groups_size_mask;
      lVar39 = uVar41 + 1;
      uVar41 = uVar41 + 1;
      piVar38 = (int *)((long)piVar38 + lVar39 & uVar36);
    } while (uVar41 <= uVar36);
  }
  goto LAB_0047f9d0;
  while( true ) {
    uVar42 = (this->instanceOverrides).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
             .arrays.groups_size_mask;
    lVar39 = uVar41 + uVar36;
    uVar36 = uVar36 + 1;
    uVar41 = lVar39 + 1U & uVar42;
    if (uVar42 < uVar36) break;
LAB_0047f004:
    pgVar13 = (this->instanceOverrides).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
              .arrays.groups_;
    pgVar7 = pgVar13 + uVar41;
    bVar25 = pgVar7->m[0xf].n;
    uVar52 = (uchar)uVar8;
    auVar56[0] = -(pgVar7->m[0].n == uVar52);
    uVar60 = (uchar)((uint)uVar8 >> 8);
    auVar56[1] = -(pgVar7->m[1].n == uVar60);
    uVar61 = (uchar)((uint)uVar8 >> 0x10);
    auVar56[2] = -(pgVar7->m[2].n == uVar61);
    bVar62 = (byte)((uint)uVar8 >> 0x18);
    auVar56[3] = -(pgVar7->m[3].n == bVar62);
    auVar56[4] = -(pgVar7->m[4].n == uVar52);
    auVar56[5] = -(pgVar7->m[5].n == uVar60);
    auVar56[6] = -(pgVar7->m[6].n == uVar61);
    auVar56[7] = -(pgVar7->m[7].n == bVar62);
    auVar56[8] = -(pgVar7->m[8].n == uVar52);
    auVar56[9] = -(pgVar7->m[9].n == uVar60);
    auVar56[10] = -(pgVar7->m[10].n == uVar61);
    auVar56[0xb] = -(pgVar7->m[0xb].n == bVar62);
    auVar56[0xc] = -(pgVar7->m[0xc].n == uVar52);
    auVar56[0xd] = -(pgVar7->m[0xd].n == uVar60);
    auVar56[0xe] = -(pgVar7->m[0xe].n == uVar61);
    auVar56[0xf] = -(bVar25 == bVar62);
    uVar27 = (uint)(ushort)((ushort)(SUB161(auVar56 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar56 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar56 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar56 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar56 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar56 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar56 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar56 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar56 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar56 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar56 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar56 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar56 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar56 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar56 >> 0x77,0) & 1) << 0xe);
    if (uVar27 != 0) {
      ppVar14 = (this->instanceOverrides).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                .arrays.elements_;
      do {
        uVar17 = 0;
        if (uVar27 != 0) {
          for (; (uVar27 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
          }
        }
        __y_00 = ppVar14 + uVar41 * 0xf + (ulong)uVar17;
        bVar24 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            this_02,(basic_string_view<char,_std::char_traits<char>_> *)
                                    &checkTopOverride,&__y_00->first);
        if (bVar24) goto LAB_0047f141;
        uVar27 = uVar27 - 1 & uVar27;
      } while (uVar27 != 0);
      bVar25 = pgVar13[uVar41].m[0xf].n;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar29 & 7] & bVar25) == 0) break;
  }
  if ((this->instanceOverrides).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
      .size_ctrl.size <
      (this->instanceOverrides).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
              ((locator *)&rule,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                *)this_02,uVar46,uVar29,(try_emplace_args_t *)&cellName,
               (basic_string_view<char,_std::char_traits<char>_> *)&checkTopOverride);
    __y_00 = (value_type_pointer)
             rule.liblist.
             super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
             ._16_8_;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
              ((locator *)&rule,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                *)this_02,uVar29,(try_emplace_args_t *)&cellName,
               (basic_string_view<char,_std::char_traits<char>_> *)&checkTopOverride);
    __y_00 = (value_type_pointer)
             rule.liblist.
             super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
             ._16_8_;
  }
LAB_0047f141:
  plVar34 = *(long **)(local_330 + 0x18);
  plVar4 = plVar34 + *(long *)(local_330 + 0x1a);
  bVar24 = false;
  for (; plVar34 != plVar4; plVar34 = plVar34 + 1) {
    cellName = parsing::Token::valueText((Token *)(*plVar34 + 0x28));
    sVar31 = cellName._M_len;
    this_01 = &__y_00->second;
    uVar29 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this_01
                        ,&cellName);
    uVar36 = uVar29 >> ((byte)(__y_00->second).childNodes.table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                              .arrays.groups_size_index & 0x3f);
    uVar8 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar29 & 0xff];
    uVar46 = 0;
    uVar41 = uVar36;
    do {
      pgVar13 = (__y_00->second).childNodes.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                .arrays.groups_;
      pgVar7 = pgVar13 + uVar41;
      bVar25 = pgVar7->m[0xf].n;
      uVar52 = (uchar)uVar8;
      auVar57[0] = -(pgVar7->m[0].n == uVar52);
      uVar60 = (uchar)((uint)uVar8 >> 8);
      auVar57[1] = -(pgVar7->m[1].n == uVar60);
      uVar61 = (uchar)((uint)uVar8 >> 0x10);
      auVar57[2] = -(pgVar7->m[2].n == uVar61);
      bVar62 = (byte)((uint)uVar8 >> 0x18);
      auVar57[3] = -(pgVar7->m[3].n == bVar62);
      auVar57[4] = -(pgVar7->m[4].n == uVar52);
      auVar57[5] = -(pgVar7->m[5].n == uVar60);
      auVar57[6] = -(pgVar7->m[6].n == uVar61);
      auVar57[7] = -(pgVar7->m[7].n == bVar62);
      auVar57[8] = -(pgVar7->m[8].n == uVar52);
      auVar57[9] = -(pgVar7->m[9].n == uVar60);
      auVar57[10] = -(pgVar7->m[10].n == uVar61);
      auVar57[0xb] = -(pgVar7->m[0xb].n == bVar62);
      auVar57[0xc] = -(pgVar7->m[0xc].n == uVar52);
      auVar57[0xd] = -(pgVar7->m[0xd].n == uVar60);
      auVar57[0xe] = -(pgVar7->m[0xe].n == uVar61);
      auVar57[0xf] = -(bVar25 == bVar62);
      uVar27 = (uint)(ushort)((ushort)(SUB161(auVar57 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar57 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar57 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar57 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar57 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar57 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar57 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar57 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar57 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar57 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar57 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar57 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar57 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar57 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar57 >> 0x77,0) & 1) << 0xe);
      if (uVar27 != 0) {
        ppVar14 = (__y_00->second).childNodes.table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                  .arrays.elements_;
        do {
          uVar17 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
            }
          }
          __y_01 = ppVar14 + uVar41 * 0xf + (ulong)uVar17;
          bVar26 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              this_01,&cellName,&__y_01->first);
          if (bVar26) goto LAB_0047f30f;
          uVar27 = uVar27 - 1 & uVar27;
        } while (uVar27 != 0);
        bVar25 = pgVar13[uVar41].m[0xf].n;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar29 & 7] & bVar25) == 0) break;
      uVar42 = (__y_00->second).childNodes.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
               .arrays.groups_size_mask;
      uVar41 = uVar46 + uVar41 + 1;
      uVar46 = uVar46 + 1;
      uVar41 = uVar41 & uVar42;
    } while (uVar46 <= uVar42);
    if ((__y_00->second).childNodes.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
        .size_ctrl.size <
        (__y_00->second).childNodes.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                ((locator *)&rule,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                  *)this_01,uVar36,uVar29,(try_emplace_args_t *)&cellName_1,&cellName);
      __y_01 = (value_type_pointer)
               rule.liblist.
               super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
               ._16_8_;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                ((locator *)&rule,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                  *)this_01,uVar29,(try_emplace_args_t *)&cellName_1,&cellName);
      __y_01 = (value_type_pointer)
               rule.liblist.
               super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
               ._16_8_;
    }
LAB_0047f30f:
    bVar24 = (bool)(bVar24 | sVar31 == 0);
    __y_00 = __y_01;
  }
  if (!bVar24) {
    resolve::anon_class_8_1_df254053::operator()
              (&rule,&buildRule,*(ConfigRuleClauseSyntax **)(local_330 + 0x1c));
    pSVar22 = scope;
    pCVar32 = (__y_00->second).rule;
    if (pCVar32 == (ConfigRule *)0x0) {
      pCVar32 = BumpAllocator::emplace<slang::ast::ConfigRule,slang::ast::ConfigRule&>
                          (&this_04->super_BumpAllocator,&rule);
      (__y_00->second).rule = pCVar32;
    }
    else if ((((rule.paramOverrides == (ParameterValueAssignmentSyntax *)0x0) ||
              (pCVar32->paramOverrides == (ParameterValueAssignmentSyntax *)0x0)) &&
             ((rule.liblist.
               super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
               ._M_engaged != true ||
              ((pCVar32->liblist).
               super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
               ._M_engaged == false)))) &&
            ((rule.useCell.name._M_len == 0 || ((pCVar32->useCell).name._M_len == 0)))) {
      if (rule.paramOverrides != (ParameterValueAssignmentSyntax *)0x0) {
        pCVar32->paramOverrides = rule.paramOverrides;
      }
      if (rule.liblist.
          super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
          ._M_engaged != false) {
        (pCVar32->liblist).
        super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
        ._M_engaged = rule.liblist.
                      super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                      ._M_engaged;
        *(undefined7 *)
         &(pCVar32->liblist).
          super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
          .field_0x11 =
             rule.liblist.
             super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
             ._17_7_;
        (pCVar32->liblist).
        super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
        ._M_payload._M_value._M_ptr =
             rule.liblist.
             super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
             ._M_payload._M_value._M_ptr;
        (pCVar32->liblist).
        super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
        ._M_payload._M_value._M_extent._M_extent_value =
             (size_t)rule.liblist.
                     super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                     ._M_payload._M_value._M_extent._M_extent_value;
      }
      if (rule.useCell.name._M_len != 0) {
        (pCVar32->useCell).targetConfig = rule.useCell.targetConfig;
        sVar70._M_str = rule.useCell.name._M_str;
        sVar70._M_len = rule.useCell.name._M_len;
        (pCVar32->useCell).sourceRange.startLoc = rule.useCell.sourceRange.startLoc;
        (pCVar32->useCell).sourceRange.endLoc = rule.useCell.sourceRange.endLoc;
        (pCVar32->useCell).name = sVar70;
        (pCVar32->useCell).lib._M_len = rule.useCell.lib._M_len;
        (pCVar32->useCell).lib._M_str = rule.useCell.lib._M_str;
        (pCVar32->syntax).ptr = rule.syntax.ptr;
      }
    }
    else {
      SVar71 = slang::syntax::SyntaxNode::sourceRange(rule.syntax.ptr);
      pDVar30 = Scope::addDiag(pSVar22,(DiagCode)0xeb0006,SVar71);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cellName,"instance \'",(allocator<char> *)&cellName_1);
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)&cellName,
                 (basic_string_view<char,_std::char_traits<char>_> *)&checkTopOverride);
      lVar39 = *(long *)(local_330 + 0x18);
      lVar50 = *(long *)(local_330 + 0x1a);
      for (lVar47 = 0; lVar50 << 3 != lVar47; lVar47 = lVar47 + 8) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cellName,
                   '.');
        cellName_1 = parsing::Token::valueText((Token *)(*(long *)(lVar39 + lVar47) + 0x28));
        std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                  ((string *)&cellName,&cellName_1);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cellName,'\''
                );
      pDVar30 = Diagnostic::operator<<
                          (pDVar30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&cellName);
      std::__cxx11::string::~string((string *)&cellName);
      SVar71 = slang::syntax::SyntaxNode::sourceRange((pCVar32->syntax).ptr);
      Diagnostic::addNote(pDVar30,(DiagCode)0xa0001,SVar71);
    }
  }
LAB_0047efb4:
  puVar33 = puVar33 + 1;
  goto LAB_0047eab0;
  while( true ) {
    uVar46 = (ppVar51->second).specificLibRules.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
             .arrays.groups_size_mask;
    lVar39 = uVar41 + uVar36;
    uVar36 = uVar36 + 1;
    uVar41 = lVar39 + 1U & uVar46;
    if (uVar46 < uVar36) break;
LAB_0047fb64:
    pgVar3 = (ppVar51->second).specificLibRules.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
             .arrays.groups_ + uVar41;
    bVar25 = pgVar3->m[0xf].n;
    uVar52 = (uchar)uVar8;
    auVar65[0] = -(pgVar3->m[0].n == uVar52);
    uVar60 = (uchar)((uint)uVar8 >> 8);
    auVar65[1] = -(pgVar3->m[1].n == uVar60);
    uVar61 = (uchar)((uint)uVar8 >> 0x10);
    auVar65[2] = -(pgVar3->m[2].n == uVar61);
    bVar62 = (byte)((uint)uVar8 >> 0x18);
    auVar65[3] = -(pgVar3->m[3].n == bVar62);
    auVar65[4] = -(pgVar3->m[4].n == uVar52);
    auVar65[5] = -(pgVar3->m[5].n == uVar60);
    auVar65[6] = -(pgVar3->m[6].n == uVar61);
    auVar65[7] = -(pgVar3->m[7].n == bVar62);
    auVar65[8] = -(pgVar3->m[8].n == uVar52);
    auVar65[9] = -(pgVar3->m[9].n == uVar60);
    auVar65[10] = -(pgVar3->m[10].n == uVar61);
    auVar65[0xb] = -(pgVar3->m[0xb].n == bVar62);
    auVar65[0xc] = -(pgVar3->m[0xc].n == uVar52);
    auVar65[0xd] = -(pgVar3->m[0xd].n == uVar60);
    auVar65[0xe] = -(pgVar3->m[0xe].n == uVar61);
    auVar65[0xf] = -(bVar25 == bVar62);
    uVar27 = (uint)(ushort)((ushort)(SUB161(auVar65 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar65 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar65 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar65 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar65 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar65 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar65 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar65 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar65 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar65 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar65 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar65 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar65 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar65 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar65 >> 0x77,0) & 1) << 0xe);
    if (uVar27 != 0) {
      ppVar12 = (ppVar51->second).specificLibRules.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                .arrays.elements_;
      do {
        iVar28 = 0;
        if (uVar27 != 0) {
          for (; (uVar27 >> iVar28 & 1) == 0; iVar28 = iVar28 + 1) {
          }
        }
        if (pSVar15 ==
            *(SourceLibrary **)((long)&ppVar12[uVar41 * 0xf].first + (ulong)(uint)(iVar28 << 4))) {
          pCVar32 = *(ConfigRule **)
                     ((long)&ppVar12[uVar41 * 0xf].second + (ulong)(uint)(iVar28 << 4));
          pTVar49->rule = pCVar32;
          goto LAB_0047fbfa;
        }
        uVar27 = uVar27 - 1 & uVar27;
      } while (uVar27 != 0);
    }
    if ((*(byte *)&src[0x3ca3].instanceOverrides.table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                   .arrays.elements_ & bVar25) == 0) break;
  }
LAB_0047fbfa:
  if (pCVar32 != (ConfigRule *)0x0) {
    resolve::anon_class_8_1_a89d2d74::operator()(&checkTopOverride,pCVar32);
    src = extraout_RDX_01;
  }
LAB_0047f9d0:
  pTVar49 = pTVar49 + 1;
  goto LAB_0047f9c0;
}

Assistant:

void ConfigBlockSymbol::resolve() const {
    SLANG_ASSERT(!resolved);
    resolved = true;

    auto scope = getParentScope();
    SLANG_ASSERT(getSyntax() && scope);

    auto& comp = scope->getCompilation();
    auto& syntax = getSyntax()->as<ConfigDeclarationSyntax>();

    SmallMap<std::string_view, size_t, 2> topCellNames;
    SmallVector<TopCell> topCellsBuf;
    for (auto cellId : syntax.topCells) {
        auto cellName = cellId->cell.valueText();
        if (!cellName.empty()) {
            auto def = comp.getDefinition(*this, cellName, cellId->library.valueText(),
                                          cellId->sourceRange());
            if (!def)
                continue;

            auto [it, inserted] = topCellNames.emplace(cellName, topCellsBuf.size());
            if (inserted)
                topCellsBuf.emplace_back(*def, cellId->sourceRange());
            else
                scope->addDiag(diag::ConfigDupTop, cellId->cell.range()) << cellName;
        }
    }

    auto buildLiblist = [&](const ConfigLiblistSyntax& cll) {
        SmallVector<const SourceLibrary*> buf;
        for (auto token : cll.libraries) {
            if (auto name = token.valueText(); !name.empty()) {
                if (auto lib = comp.getSourceLibrary(name))
                    buf.push_back(lib);
                else
                    scope->addDiag(diag::WarnUnknownLibrary, token.range()) << name;
            }
        }
        return buf.copy(comp);
    };

    auto buildRule = [&](const ConfigRuleClauseSyntax& rule) {
        ConfigRule result(*rule.parent);
        if (rule.kind == SyntaxKind::ConfigUseClause) {
            auto& cuc = rule.as<ConfigUseClauseSyntax>();
            result.paramOverrides = cuc.paramAssignments;
            if (cuc.name && !cuc.name->cell.valueText().empty()) {
                result.useCell.lib = cuc.name->library.valueText();
                result.useCell.name = cuc.name->cell.valueText();
                result.useCell.sourceRange = cuc.name->sourceRange();
                if (cuc.config)
                    result.useCell.targetConfig = true;
            }
        }
        else {
            result.liblist = buildLiblist(rule.as<ConfigLiblistSyntax>());
        }
        return result;
    };

    auto mergeRules = [&](ConfigRule& curRule, const ConfigRule& newRule, auto&& nameGetter) {
        if ((bool(newRule.paramOverrides) && bool(curRule.paramOverrides)) ||
            (newRule.liblist.has_value() && curRule.liblist.has_value()) ||
            (!newRule.useCell.name.empty() && !curRule.useCell.name.empty())) {

            auto& diag = scope->addDiag(diag::DupConfigRule, newRule.syntax->sourceRange())
                         << nameGetter();
            diag.addNote(diag::NotePreviousDefinition, curRule.syntax->sourceRange());
        }
        else {
            if (newRule.paramOverrides)
                curRule.paramOverrides = newRule.paramOverrides;
            if (newRule.liblist)
                curRule.liblist = newRule.liblist;
            if (!newRule.useCell.name.empty()) {
                // Note: prefer the source range to come from the rule that
                // supplies a use cell name, to make other reported errors easier
                // to understand.
                curRule.useCell = newRule.useCell;
                curRule.syntax = newRule.syntax;
            }
        }
    };

    for (auto ruleSyntax : syntax.rules) {
        switch (ruleSyntax->kind) {
            case SyntaxKind::DefaultConfigRule:
                defaultLiblist = buildLiblist(*ruleSyntax->as<DefaultConfigRuleSyntax>().liblist);
                break;
            case SyntaxKind::CellConfigRule: {
                auto& ccr = ruleSyntax->as<CellConfigRuleSyntax>();
                auto cellName = ccr.name->cell.valueText();
                if (cellName.empty())
                    break;

                auto rule = comp.emplace<ConfigRule>(buildRule(*ccr.ruleClause));

                auto& overrides = cellOverrides[cellName];
                if (auto libName = ccr.name->library.valueText(); !libName.empty()) {
                    auto specificLib = comp.getSourceLibrary(libName);
                    if (!specificLib) {
                        scope->addDiag(diag::WarnUnknownLibrary, ccr.name->library.range())
                            << libName;
                        break;
                    }

                    auto [it, inserted] = overrides.specificLibRules.emplace(specificLib, rule);
                    if (!inserted) {
                        mergeRules(*it->second, *rule, [&] {
                            return fmt::format("cell '{}.{}'", specificLib->name, cellName);
                        });
                    }
                }
                else if (overrides.defaultRule) {
                    mergeRules(*overrides.defaultRule, *rule,
                               [&] { return fmt::format("cell '{}'", cellName); });
                }
                else {
                    overrides.defaultRule = rule;
                }
                break;
            }
            case SyntaxKind::InstanceConfigRule: {
                auto& icr = ruleSyntax->as<InstanceConfigRuleSyntax>();
                const auto topName = icr.topModule.valueText();
                if (topName.empty())
                    break;

                if (!topCellNames.contains(topName)) {
                    scope->addDiag(diag::ConfigInstanceWrongTop, icr.topModule.range());
                    break;
                }

                bool bad = false;
                auto node = &instanceOverrides[topName];
                for (auto& part : icr.instanceNames) {
                    auto partName = part->name.valueText();
                    bad |= partName.empty();
                    node = &node->childNodes[partName];
                }

                if (bad)
                    break;

                auto rule = buildRule(*icr.ruleClause);
                if (!node->rule) {
                    // No rule here yet; copy into our allocator and save it.
                    node->rule = comp.emplace<ConfigRule>(rule);
                }
                else {
                    // Merge the two rules, or warn if we cannot.
                    mergeRules(*node->rule, rule, [&] {
                        std::string name = "instance '";
                        name += topName;
                        for (auto& part : icr.instanceNames) {
                            name.push_back('.');
                            name += part->name.valueText();
                        }
                        name.push_back('\'');
                        return name;
                    });
                }
                break;
            }
            default:
                SLANG_UNREACHABLE;
        }
    }

    auto checkTopOverride = [&](const ConfigRule& rule) {
        if (!rule.useCell.name.empty())
            scope->addDiag(diag::ConfigOverrideTop, rule.syntax->sourceRange());
    };

    // Check if any overrides should apply to the root instances.
    for (auto& [cellName, instOverride] : instanceOverrides) {
        if (instOverride.rule) {
            auto it = topCellNames.find(cellName);
            SLANG_ASSERT(it != topCellNames.end());
            checkTopOverride(*instOverride.rule);
            topCellsBuf[it->second].rule = instOverride.rule;
        }
    }

    for (auto& topCell : topCellsBuf) {
        // If we already set a rule for this cell via an instance
        // override we don't need a less specific cell override.
        if (topCell.rule)
            continue;

        if (auto it = cellOverrides.find(topCell.definition.name); it != cellOverrides.end()) {
            topCell.rule = it->second.defaultRule;
            auto& specificLibRules = it->second.specificLibRules;
            if (auto specificIt = specificLibRules.find(&topCell.definition.sourceLibrary);
                specificIt != specificLibRules.end()) {
                topCell.rule = specificIt->second;
            }

            if (topCell.rule)
                checkTopOverride(*topCell.rule);
        }
    }

    topCells = topCellsBuf.copy(comp);

    // Now that all rules have been resolved, go back through and
    // register them for later lookup by syntax.
    for (auto& [_, cellOverride] : cellOverrides) {
        if (cellOverride.defaultRule)
            ruleBySyntax[cellOverride.defaultRule->syntax] = cellOverride.defaultRule;

        for (auto& [lib, rule] : cellOverride.specificLibRules)
            ruleBySyntax[rule->syntax] = rule;
    }

    for (auto& [_, instOverride] : getInstanceOverrides())
        registerRules(instOverride);
}